

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D64.cpp
# Opt level: O3

void __thiscall Storage::Disk::D64::D64(D64 *this,string *file_name)

{
  FileHolder *this_00;
  size_type sVar1;
  pointer pcVar2;
  stat *psVar3;
  undefined4 *puVar4;
  size_type sVar5;
  uint uVar6;
  string *__range1;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__D64_005a2380;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  psVar3 = FileHolder::stats(this_00);
  if (psVar3->st_size != 0x2ab00) {
    psVar3 = FileHolder::stats(this_00);
    if (psVar3->st_size != 0x30000) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0xfffffffe;
      __cxa_throw(puVar4,&Error::typeinfo,0);
    }
  }
  psVar3 = FileHolder::stats(this_00);
  this->number_of_tracks_ = (uint)(psVar3->st_size != 0x2ab00) * 5 + 0x23;
  this->disk_id_ = 0;
  sVar1 = file_name->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (file_name->_M_dataplus)._M_p;
    sVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 ^ (int)pcVar2[sVar5];
      uVar6 = (uVar6 & 0xffff) >> 0xd ^ uVar6 << 2;
      this->disk_id_ = (uint16_t)uVar6;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return;
}

Assistant:

D64::D64(const std::string &file_name) :
		file_(file_name) {
	// in D64, this is it for validation without imposing potential false-negative tests: check that
	// the file size appears to be correct. Stone-age stuff.
	if(file_.stats().st_size != 174848 && file_.stats().st_size != 196608)
		throw Error::InvalidFormat;

	number_of_tracks_ = (file_.stats().st_size == 174848) ? 35 : 40;

	// then, ostensibly, this is a valid file. Hmmm. Pick a disk ID as a function of the file_name,
	// being the most stable thing available
	disk_id_ = 0;
	for(const auto &character: file_name) {
		disk_id_ ^= character;
		disk_id_ = uint16_t((disk_id_ << 2) ^ (disk_id_ >> 13));
	}
}